

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

result<sockpp::none> * __thiscall
sockpp::socket::get_option
          (result<sockpp::none> *__return_storage_ptr__,socket *this,int level,int optname,
          void *optval,socklen_t *optlen)

{
  uint uVar1;
  int ret;
  result<int> local_30;
  
  uVar1 = getsockopt(this->handle_,level,optname,optval,optlen);
  check_res<int,int>(&local_30,(socket *)(ulong)uVar1,ret);
  if (local_30.err_._M_value == 0) {
    local_30.err_._M_cat = (error_category *)std::_V2::system_category();
    local_30.err_._M_value = 0;
  }
  (__return_storage_ptr__->err_)._M_value = local_30.err_._M_value;
  *(undefined4 *)&(__return_storage_ptr__->err_).field_0x4 = local_30.err_._4_4_;
  (__return_storage_ptr__->err_)._M_cat = local_30.err_._M_cat;
  return __return_storage_ptr__;
}

Assistant:

result<> socket::get_option(
    int level, int optname, void* optval, socklen_t* optlen
) const noexcept {
    result<int> res;
#if defined(_WIN32)
    if (optval && optlen) {
        int len = static_cast<int>(*optlen);
        res = check_res(
            ::getsockopt(handle_, level, optname, static_cast<char*>(optval), &len)
        );
        if (res) {
            *optlen = static_cast<socklen_t>(len);
        }
    }
#else
    res = check_res(::getsockopt(handle_, level, optname, optval, optlen));
#endif
    return (res) ? error_code{} : res.error();
}